

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

OutputType __thiscall
wallet::CWallet::TransactionChangeType
          (CWallet *this,optional<OutputType> *change_type,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *vecSend)

{
  __index_type _Var1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  pointer pCVar5;
  ScriptPubKeyMan *pSVar6;
  ScriptPubKeyMan *pSVar7;
  ScriptPubKeyMan *pSVar8;
  OutputType OVar9;
  byte bVar10;
  long in_FS_OFFSET;
  OutputType local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((change_type->super__Optional_base<OutputType,_true,_true>)._M_payload.
      super__Optional_payload_base<OutputType>._M_engaged == true) {
    OVar9 = (change_type->super__Optional_base<OutputType,_true,_true>)._M_payload.
            super__Optional_payload_base<OutputType>._M_payload._M_value;
  }
  else if (this->m_default_address_type == LEGACY) {
    OVar9 = LEGACY;
  }
  else {
    bVar10 = 0;
    bVar4 = 0;
    bVar3 = 0;
    bVar2 = 0;
    for (pCVar5 = (vecSend->
                  super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar5 != (vecSend->
                  super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
                  _M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
      if (pCVar5 != (pointer)0x0) {
        _Var1 = *(__index_type *)
                 ((long)&(pCVar5->dest).
                         super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         .
                         super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 + 0x48);
        if (_Var1 == '\x03') {
          bVar4 = 1;
        }
        else if (_Var1 == '\x05') {
          bVar3 = 1;
        }
        else if (_Var1 == '\x06') {
          bVar2 = 1;
        }
        else {
          bVar10 = bVar10 | _Var1 == '\x02';
        }
      }
    }
    local_3c = BECH32M;
    pSVar6 = GetScriptPubKeyMan(this,&local_3c,true);
    if ((bool)(pSVar6 != (ScriptPubKeyMan *)0x0 & bVar2)) {
      OVar9 = BECH32M;
    }
    else {
      local_3c = BECH32;
      OVar9 = P2SH_SEGWIT;
      pSVar7 = GetScriptPubKeyMan(this,&local_3c,true);
      if (!(bool)(pSVar7 != (ScriptPubKeyMan *)0x0 & bVar3)) {
        local_3c = P2SH_SEGWIT;
        pSVar8 = GetScriptPubKeyMan(this,&local_3c,true);
        if ((bool)(pSVar8 != (ScriptPubKeyMan *)0x0 & bVar4)) goto LAB_009a756b;
        local_3c = LEGACY;
        pSVar8 = GetScriptPubKeyMan(this,&local_3c,true);
        if (pSVar8 == (ScriptPubKeyMan *)0x0) {
          OVar9 = BECH32M;
          if (pSVar6 != (ScriptPubKeyMan *)0x0) goto LAB_009a756b;
        }
        else if ((bool)(pSVar6 != (ScriptPubKeyMan *)0x0 | bVar10)) {
          OVar9 = (uint)(byte)~bVar10 * 3;
          goto LAB_009a756b;
        }
        if (pSVar7 == (ScriptPubKeyMan *)0x0) {
          OVar9 = this->m_default_address_type;
          goto LAB_009a756b;
        }
      }
      OVar9 = BECH32;
    }
  }
LAB_009a756b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return OVar9;
  }
  __stack_chk_fail();
}

Assistant:

OutputType CWallet::TransactionChangeType(const std::optional<OutputType>& change_type, const std::vector<CRecipient>& vecSend) const
{
    // If -changetype is specified, always use that change type.
    if (change_type) {
        return *change_type;
    }

    // if m_default_address_type is legacy, use legacy address as change.
    if (m_default_address_type == OutputType::LEGACY) {
        return OutputType::LEGACY;
    }

    bool any_tr{false};
    bool any_wpkh{false};
    bool any_sh{false};
    bool any_pkh{false};

    for (const auto& recipient : vecSend) {
        if (std::get_if<WitnessV1Taproot>(&recipient.dest)) {
            any_tr = true;
        } else if (std::get_if<WitnessV0KeyHash>(&recipient.dest)) {
            any_wpkh = true;
        } else if (std::get_if<ScriptHash>(&recipient.dest)) {
            any_sh = true;
        } else if (std::get_if<PKHash>(&recipient.dest)) {
            any_pkh = true;
        }
    }

    const bool has_bech32m_spkman(GetScriptPubKeyMan(OutputType::BECH32M, /*internal=*/true));
    if (has_bech32m_spkman && any_tr) {
        // Currently tr is the only type supported by the BECH32M spkman
        return OutputType::BECH32M;
    }
    const bool has_bech32_spkman(GetScriptPubKeyMan(OutputType::BECH32, /*internal=*/true));
    if (has_bech32_spkman && any_wpkh) {
        // Currently wpkh is the only type supported by the BECH32 spkman
        return OutputType::BECH32;
    }
    const bool has_p2sh_segwit_spkman(GetScriptPubKeyMan(OutputType::P2SH_SEGWIT, /*internal=*/true));
    if (has_p2sh_segwit_spkman && any_sh) {
        // Currently sh_wpkh is the only type supported by the P2SH_SEGWIT spkman
        // As of 2021 about 80% of all SH are wrapping WPKH, so use that
        return OutputType::P2SH_SEGWIT;
    }
    const bool has_legacy_spkman(GetScriptPubKeyMan(OutputType::LEGACY, /*internal=*/true));
    if (has_legacy_spkman && any_pkh) {
        // Currently pkh is the only type supported by the LEGACY spkman
        return OutputType::LEGACY;
    }

    if (has_bech32m_spkman) {
        return OutputType::BECH32M;
    }
    if (has_bech32_spkman) {
        return OutputType::BECH32;
    }
    // else use m_default_address_type for change
    return m_default_address_type;
}